

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O0

int __thiscall Jupiter::HTTP::Server::Data::process_request(Data *this,HTTPSession *session)

{
  int iVar1;
  long *plVar2;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> lhs_01;
  basic_string_view<char,_std::char_traits<char>_> lhs_02;
  string_view name_00;
  basic_string_view<char,_std::char_traits<char>_> lhs_03;
  basic_string_view<char,_std::char_traits<char>_> lhs_04;
  string_view name_01;
  basic_string_view<char,_std::char_traits<char>_> lhs_05;
  size_t sVar3;
  size_t sVar4;
  pointer pbVar5;
  bool bVar6;
  size_type sVar7;
  size_t sVar8;
  reference pvVar9;
  const_reference pvVar10;
  size_type __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  _If_sv<std::basic_string_view<char>,_size_type> _Var12;
  Host *pHVar13;
  size_type sVar14;
  char *pcVar15;
  int in_R8D;
  bool bVar16;
  __sv_type _Var17;
  basic_string_view<char,_std::char_traits<char>_> bVar18;
  string_view protocol_str_1;
  basic_string_view<char,_std::char_traits<char>_> local_498;
  undefined4 local_488;
  undefined4 uStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  char *local_478;
  size_t sStack_470;
  undefined1 local_459 [9];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  second_split_1;
  char *local_430;
  string_view protocol_str;
  basic_string_view<char,_std::char_traits<char>_> local_3a8;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  char *local_388;
  size_t sStack_380;
  undefined1 local_369 [9];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  second_split;
  char *local_340;
  string_view connection_type;
  undefined1 local_2a1 [9];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  first_split;
  int local_25c;
  char *local_250;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  char *local_1f8;
  char *time_header_1;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  __sv_type local_1d0;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  basic_string_view<char,_std::char_traits<char>_> local_180;
  string local_170;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  char *local_130;
  char *time_header;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  string *content_result;
  undefined1 local_c8 [8];
  string result;
  string_view line;
  anon_class_16_2_8b1b1152 get_line_offset;
  size_t span;
  size_t index;
  string_view first_token;
  string_view query_string;
  Content *content;
  undefined1 auStack_48 [4];
  HTTPCommand command;
  undefined1 local_38 [8];
  container_type lines;
  HTTPSession *session_local;
  Data *this_local;
  
  lines.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)session;
  _auStack_48 = sv("\r\n",2);
  jessilib::
  split_view<std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ((container_type *)local_38,&session->request,
             (basic_string_view<char,_std::char_traits<char>_> *)auStack_48);
  content._4_4_ = 3;
  query_string._M_str = (char *)0x0;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&first_token._M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&index);
  span = 0;
  line._M_str = (char *)lines.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    sVar7 = std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)local_38);
    if (span == sVar7) {
LAB_0019b426:
      this_local._4_4_ = 0;
LAB_0019b437:
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)local_38);
      return this_local._4_4_;
    }
    sVar8 = span + 1;
    pvVar9 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)local_38,span);
    pcVar15 = (char *)pvVar9->_M_len;
    line._M_len = (size_t)pvVar9->_M_str;
    result.field_2._8_8_ = pcVar15;
    while( true ) {
      bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         ((long)&result.field_2 + 8));
      pcVar15 = (char *)CONCAT71((int7)((ulong)pcVar15 >> 8),bVar6);
      bVar16 = false;
      if (!bVar6) {
        pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::front
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             ((long)&result.field_2 + 8));
        bVar16 = *pvVar10 == ' ';
      }
      if (!bVar16) break;
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)((long)&result.field_2 + 8),1);
    }
    bVar16 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                        ((long)&result.field_2 + 8));
    if (!bVar16) {
      std::__cxx11::string::string((string *)local_c8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,0x100
                );
      if (content._4_4_ < 2) {
        if (query_string._M_str == (char *)0x0) {
          iVar1 = (int)lines.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[4]._M_len;
          if ((iVar1 == 0) || (iVar1 != 1)) {
            local_1e0 = sv("HTTP/1.0 404 Not Found\r\n",0x18);
            std::__cxx11::string::operator=((string *)local_c8,&local_1e0);
          }
          else {
            _time_header_1 = sv("HTTP/1.1 404 Not Found\r\n",0x18);
            std::__cxx11::string::operator=
                      ((string *)local_c8,
                       (basic_string_view<char,_std::char_traits<char>_> *)&time_header_1);
          }
          local_1f8 = html_time();
          local_208 = sv("Date: \r\n",8);
          std::__cxx11::string::operator+=((string *)local_c8,&local_208);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     local_1f8);
          if (local_1f8 != (char *)0x0) {
            operator_delete__(local_1f8);
          }
          local_218 = sv("Server: Jupiter master-2f1261b (Linux Apr 26 2025)\r\n",0x34);
          std::__cxx11::string::operator+=((string *)local_c8,&local_218);
          local_228 = sv("Content-Length: 0\r\n",0x13);
          std::__cxx11::string::operator+=((string *)local_c8,&local_228);
          if ((lines.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_len & 1) == 0) {
            local_248 = sv("Connection: close\r\n",0x13);
            std::__cxx11::string::operator+=((string *)local_c8,&local_248);
          }
          else {
            local_238 = sv("Connection: keep-alive\r\n",0x18);
            std::__cxx11::string::operator+=((string *)local_c8,&local_238);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     "\r\n\r\n");
          pbVar5 = lines.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          _Var17 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_c8);
          local_250 = _Var17._M_str;
          Socket::send((Socket *)pbVar5,(int)_Var17._M_len,local_250,(size_t)pcVar15,in_R8D);
        }
        else {
          local_f8 = first_token._M_str._0_4_;
          uStack_f4 = first_token._M_str._4_4_;
          uStack_f0 = (undefined4)query_string._M_len;
          uStack_ec = query_string._M_len._4_4_;
          local_e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(code *)**(undefined8 **)query_string._M_str)
                               (query_string._M_str,first_token._M_str,query_string._M_len);
          iVar1 = (int)lines.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[4]._M_len;
          if ((iVar1 == 0) || (iVar1 != 1)) {
            local_108 = sv("HTTP/1.0 200 OK\r\n",0x11);
            std::__cxx11::string::operator=((string *)local_c8,&local_108);
          }
          else {
            local_118 = sv("HTTP/1.1 200 OK\r\n",0x11);
            std::__cxx11::string::operator=((string *)local_c8,&local_118);
          }
          _time_header = sv("Date: ",6);
          std::__cxx11::string::operator+=
                    ((string *)local_c8,
                     (basic_string_view<char,_std::char_traits<char>_> *)&time_header);
          local_130 = html_time();
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     local_130);
          if (local_130 != (char *)0x0) {
            operator_delete__(local_130);
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     "\r\n");
          local_140 = sv("Server: Jupiter master-2f1261b (Linux Apr 26 2025)\r\n",0x34);
          std::__cxx11::string::operator+=((string *)local_c8,&local_140);
          local_150 = sv("Content-Length: ",0x10);
          std::__cxx11::string::operator+=((string *)local_c8,&local_150);
          __val = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  size(local_e0);
          std::__cxx11::to_string(&local_170,__val);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     &local_170);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     "\r\n");
          if ((lines.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_len & 1) == 0) {
            local_190 = sv("Connection: close\r\n",0x13);
            std::__cxx11::string::operator+=((string *)local_c8,&local_190);
          }
          else {
            local_180 = sv("Connection: keep-alive\r\n",0x18);
            std::__cxx11::string::operator+=((string *)local_c8,&local_180);
          }
          local_1a0 = sv("Content-Type: ",0xe);
          std::__cxx11::string::operator+=((string *)local_c8,&local_1a0);
          bVar16 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              (query_string._M_str + 0x50));
          if (bVar16) {
            std::__cxx11::string::operator+=
                      ((string *)local_c8,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       HTTP::Content::Type::Text::PLAIN);
          }
          else {
            std::__cxx11::string::operator+=
                      ((string *)local_c8,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       (query_string._M_str + 0x50));
          }
          bVar16 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              (query_string._M_str + 0x60));
          if (!bVar16) {
            local_1b0 = sv("; charset=",10);
            std::__cxx11::string::operator+=((string *)local_c8,&local_1b0);
            std::__cxx11::string::operator+=
                      ((string *)local_c8,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       (query_string._M_str + 0x60));
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     "\r\n");
          bVar16 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              (query_string._M_str + 0x40));
          if (!bVar16) {
            local_1c0 = sv("Content-Language: ",0x12);
            std::__cxx11::string::operator+=((string *)local_c8,&local_1c0);
            std::__cxx11::string::operator+=
                      ((string *)local_c8,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       (query_string._M_str + 0x40));
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,"\r\n");
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     "\r\n");
          if (content._4_4_ == 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8
                       ,local_e0);
          }
          pbVar11 = local_e0;
          if (((query_string._M_str[8] & 1U) != 0) &&
             (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0))
          {
            std::__cxx11::string::~string((string *)local_e0);
            operator_delete(pbVar11,0x20);
          }
          pbVar5 = lines.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1d0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_c8);
          Socket::send((Socket *)pbVar5,(int)local_1d0._M_len,local_1d0._M_str,(size_t)pcVar15,
                       in_R8D);
        }
      }
      if ((lines.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_len & 1) == 0) {
        local_25c = 3;
      }
      else {
        sVar7 = std::
                vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        *)local_38);
        if (sVar8 == sVar7) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lines.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),0,0xffffffffffffffff);
        }
        else {
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (lines.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          sVar8 = process_request::anon_class_16_2_8b1b1152::operator()
                            ((anon_class_16_2_8b1b1152 *)&line._M_str,sVar8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &first_split.second._M_str,pbVar11,sVar8,0xffffffffffffffff);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (lines.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &first_split.second._M_str);
          std::__cxx11::string::~string((string *)&first_split.second._M_str);
        }
        _Var12 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                           ((string *)
                            (lines.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1),
                            &HTTP_REQUEST_ENDING,0);
        if (_Var12 == 0xffffffffffffffff) {
          local_25c = 3;
        }
        else {
          this_local._4_4_ =
               process_request(this,(HTTPSession *)
                                    lines.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_25c = 1;
        }
      }
      std::__cxx11::string::~string((string *)local_c8);
      if (local_25c != 3) goto LAB_0019b437;
      goto LAB_0019b426;
    }
    local_2a1[0] = 0x20;
    jessilib::split_once_view<,std::basic_string_view<char,std::char_traits<char>>,char>
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)(local_2a1 + 1),(jessilib *)(result.field_2._M_local_buf + 8),
               (basic_string_view<char,_std::char_traits<char>_> *)local_2a1,pcVar15);
    index = local_2a1._1_8_;
    first_token._M_len = first_split.first._M_len;
    pvVar10 = std::basic_string_view<char,_std::char_traits<char>_>::back
                        ((basic_string_view<char,_std::char_traits<char>_> *)&index);
    sVar4 = first_token._M_len;
    sVar3 = index;
    span = sVar8;
    if (*pvVar10 == ':') {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                ((basic_string_view<char,_std::char_traits<char>_> *)&index,1);
      sVar3 = first_token._M_len;
      sVar8 = index;
      bVar18 = sv("HOST",4);
      lhs_05._M_str = (char *)sVar3;
      lhs_05._M_len = sVar8;
      bVar16 = jessilib::equalsi<char,char>(lhs_05,bVar18);
      sVar3 = first_token._M_len;
      sVar8 = index;
      if (bVar16) {
        name_01._M_str = (char *)first_split.second._M_len;
        name_01._M_len = (size_t)first_split.first._M_str;
        pHVar13 = find_host(this,name_01);
        lines.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_str = (char *)pHVar13;
      }
      else {
        bVar18 = sv("CONNECTION",10);
        lhs_04._M_str = (char *)sVar3;
        lhs_04._M_len = sVar8;
        bVar16 = jessilib::equalsi<char,char>(lhs_04,bVar18);
        sVar8 = first_split.second._M_len;
        pcVar15 = first_split.first._M_str;
        if (bVar16) {
          bVar18 = sv("keep-alive",10);
          lhs_03._M_str = (char *)sVar8;
          lhs_03._M_len = (size_t)pcVar15;
          bVar16 = jessilib::equalsi<char,char>(lhs_03,bVar18);
          if (bVar16) {
            *(byte *)&lines.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_len =
                 this->permit_keept_alive & 1;
          }
        }
      }
    }
    else {
      join_0x00000010_0x00000000_ = sv("GET",3);
      bVar18._M_str = (char *)sVar4;
      bVar18._M_len = sVar3;
      pcVar15 = local_340;
      bVar16 = std::operator==(bVar18,join_0x00000010_0x00000000_);
      sVar3 = first_token._M_len;
      sVar8 = index;
      if (bVar16) {
        content._4_4_ = 0;
        local_369[0] = 0x20;
        jessilib::split_once_view<,std::basic_string_view<char,std::char_traits<char>>,char>
                  ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)(local_369 + 1),(jessilib *)&first_split.first._M_str,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_369,pcVar15);
        sVar8 = second_split.first._M_len;
        first_token._M_str = (char *)local_369._1_8_;
        query_string._M_len = second_split.first._M_len;
        sVar14 = std::basic_string_view<char,_std::char_traits<char>_>::find
                           ((basic_string_view<char,_std::char_traits<char>_> *)&first_token._M_str,
                            '?',0);
        if (sVar14 == 0xffffffffffffffff) {
          if (lines.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_str == (char *)0x0) {
            local_388 = first_token._M_str;
            sStack_380 = sVar8;
            name_00._M_str = (char *)sVar8;
            name_00._M_len = (size_t)first_token._M_str;
            query_string._M_str = (char *)find(this,name_00);
          }
          else {
            query_string._M_len._0_4_ = (undefined4)sVar8;
            query_string._M_len._4_4_ = (undefined4)(sVar8 >> 0x20);
            local_398 = first_token._M_str._0_4_;
            uStack_394 = first_token._M_str._4_4_;
            uStack_390 = (undefined4)query_string._M_len;
            uStack_38c = query_string._M_len._4_4_;
            query_string._M_str =
                 (char *)(**(code **)(*(long *)lines.
                                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage[3]
                                               ._M_str + 0x18))
                                   (lines.
                                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_str,
                                    first_token._M_str,sVar8);
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3a8);
          first_token._M_str = (char *)local_3a8._M_len;
          query_string._M_len = (size_t)local_3a8._M_str;
        }
        else {
          if (lines.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_str == (char *)0x0) {
            bVar18 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)
                                &first_token._M_str,0,sVar14);
            query_string._M_str = (char *)find(this,bVar18);
          }
          else {
            plVar2 = (long *)lines.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_str;
            bVar18 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)
                                &first_token._M_str,0,sVar14);
            query_string._M_str =
                 (char *)(**(code **)(*plVar2 + 0x18))(plVar2,bVar18._M_len,bVar18._M_str);
          }
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&first_token._M_str,
                     sVar14 + 1);
        }
        sVar8 = second_split.second._M_len;
        pcVar15 = second_split.first._M_str;
        bVar18 = sv("http/1.0",8);
        lhs_02._M_str = (char *)sVar8;
        lhs_02._M_len = (size_t)pcVar15;
        bVar16 = jessilib::equalsi<char,char>(lhs_02,bVar18);
        if (bVar16) {
          *(undefined4 *)
           &lines.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage[4]._M_len = 0;
        }
        else {
          bVar18 = sv("http/1.1",8);
          lhs_01._M_str = (char *)sVar8;
          lhs_01._M_len = (size_t)pcVar15;
          bVar16 = jessilib::equalsi<char,char>(lhs_01,bVar18);
          if (bVar16) {
            *(undefined4 *)
             &lines.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage[4]._M_len = 1;
            *(byte *)&lines.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_len =
                 this->permit_keept_alive & 1;
          }
        }
      }
      else {
        join_0x00000010_0x00000000_ = sv("HEAD",4);
        __x._M_str = (char *)sVar3;
        __x._M_len = sVar8;
        pcVar15 = local_430;
        bVar16 = std::operator==(__x,join_0x00000010_0x00000000_);
        if (bVar16) {
          content._4_4_ = 1;
          local_459[0] = 0x20;
          jessilib::split_once_view<,std::basic_string_view<char,std::char_traits<char>>,char>
                    ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                      *)(local_459 + 1),(jessilib *)&first_split.first._M_str,
                     (basic_string_view<char,_std::char_traits<char>_> *)local_459,pcVar15);
          sVar8 = second_split_1.first._M_len;
          first_token._M_str = (char *)local_459._1_8_;
          query_string._M_len = second_split_1.first._M_len;
          sVar14 = std::basic_string_view<char,_std::char_traits<char>_>::find
                             ((basic_string_view<char,_std::char_traits<char>_> *)
                              &first_token._M_str,'?',0);
          if (sVar14 == 0xffffffffffffffff) {
            if (lines.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_str == (char *)0x0) {
              local_478 = first_token._M_str;
              sStack_470 = sVar8;
              name._M_str = (char *)sVar8;
              name._M_len = (size_t)first_token._M_str;
              query_string._M_str = (char *)find(this,name);
            }
            else {
              query_string._M_len._0_4_ = (undefined4)sVar8;
              query_string._M_len._4_4_ = (undefined4)(sVar8 >> 0x20);
              local_488 = first_token._M_str._0_4_;
              uStack_484 = first_token._M_str._4_4_;
              uStack_480 = (undefined4)query_string._M_len;
              uStack_47c = query_string._M_len._4_4_;
              query_string._M_str =
                   (char *)(**(code **)(*(long *)lines.
                                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 [3]._M_str + 0x18))
                                     (lines.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_str,
                                      first_token._M_str,sVar8);
            }
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_498);
            first_token._M_str = (char *)local_498._M_len;
            query_string._M_len = (size_t)local_498._M_str;
          }
          else {
            if (lines.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_str == (char *)0x0) {
              bVar18 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                 ((basic_string_view<char,_std::char_traits<char>_> *)
                                  &first_token._M_str,0,sVar14);
              query_string._M_str = (char *)find(this,bVar18);
            }
            else {
              plVar2 = (long *)lines.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_str;
              bVar18 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                 ((basic_string_view<char,_std::char_traits<char>_> *)
                                  &first_token._M_str,0,sVar14);
              query_string._M_str =
                   (char *)(**(code **)(*plVar2 + 0x18))(plVar2,bVar18._M_len,bVar18._M_str);
            }
            std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                      ((basic_string_view<char,_std::char_traits<char>_> *)&first_token._M_str,
                       sVar14 + 1);
          }
          sVar8 = second_split_1.second._M_len;
          pcVar15 = second_split_1.first._M_str;
          bVar18 = sv("http/1.0",8);
          lhs_00._M_str = (char *)sVar8;
          lhs_00._M_len = (size_t)pcVar15;
          bVar16 = jessilib::equalsi<char,char>(lhs_00,bVar18);
          if (bVar16) {
            *(undefined4 *)
             &lines.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage[4]._M_len = 0;
          }
          else {
            bVar18 = sv("http/1.1",8);
            lhs._M_str = (char *)sVar8;
            lhs._M_len = (size_t)pcVar15;
            bVar16 = jessilib::equalsi<char,char>(lhs,bVar18);
            if (bVar16) {
              *(undefined4 *)
               &lines.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[4]._M_len = 1;
              *(byte *)&lines.
                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[3]._M_len =
                   this->permit_keept_alive & 1;
            }
          }
        }
        else {
          content._4_4_ = 2;
        }
      }
    }
  } while( true );
}

Assistant:

int Jupiter::HTTP::Server::Data::process_request(HTTPSession &session) {
	auto lines = jessilib::split_view(session.request, "\r\n"sv);
	HTTPCommand command = HTTPCommand::NONE_SPECIFIED;
	Content *content = nullptr;
	std::string_view query_string;
	std::string_view first_token;
	size_t index = 0;
	size_t span;

	auto get_line_offset = [&session, &lines](size_t index)
	{
		size_t offset = 0;
		while (index != 0)
			offset += lines[--index].size() + 2;
		return offset;
	};

	while (index != lines.size())
	{
		std::string_view line = lines[index++];

		// trim front-end spaces.
		while (!line.empty() && line.front() == ' ') {
			line.remove_prefix(1);
		}

		if (!line.empty()) // end of http request
		{
			std::string result;
			result.reserve(256);
			switch (command)
			{
			case HTTPCommand::GET:
			case HTTPCommand::HEAD:
				if (content != nullptr)
				{
					// 200 (success)
					// TODO: remove referencestring warpper
					std::string* content_result = content->execute(query_string);

					switch (session.version)
					{
					default:
					case HTTPVersion::HTTP_1_0:
						result = "HTTP/1.0 200 OK"sv HTTP_ENDL;
						break;
					case HTTPVersion::HTTP_1_1:
						result = "HTTP/1.1 200 OK"sv HTTP_ENDL;
						break;
					}

					result += "Date: "sv;
					char *time_header = html_time();
					result += time_header;
					delete[] time_header;
					result += HTTP_ENDL;

					result += "Server: "sv JUPITER_VERSION HTTP_ENDL;
					result += "Content-Length: "sv;
					result += std::to_string(content_result->size()); // TODO: to_chars?
					result += HTTP_ENDL;

					if (session.keep_alive)
						result += "Connection: keep-alive"sv HTTP_ENDL;
					else
						result += "Connection: close"sv HTTP_ENDL;

					result += "Content-Type: "sv;
					if (content->type.empty()) {
						result += Jupiter::HTTP::Content::Type::Text::PLAIN;
					}
					else {
						result += content->type;
					}

					if (!content->charset.empty()) {
						result += "; charset="sv;
						result += content->charset;
					}
					result += HTTP_ENDL;

					if (!content->language.empty()) {
						result += "Content-Language: "sv;
						result += content->language;
						result += HTTP_ENDL;
					}

					result += HTTP_ENDL;
					if (command == HTTPCommand::GET)
						result += *content_result;

					if (content->free_result)
						delete content_result;

					session.sock.send(result);
				}
				else
				{
					// 404 (not found)

					switch (session.version)
					{
					default:
					case HTTPVersion::HTTP_1_0:
						result = "HTTP/1.0 404 Not Found"sv HTTP_ENDL;
						break;
					case HTTPVersion::HTTP_1_1:
						result = "HTTP/1.1 404 Not Found"sv HTTP_ENDL;
						break;
					}

					char *time_header = html_time();
					result += "Date: "sv HTTP_ENDL;
					result += time_header;
					delete[] time_header;

					result += "Server: "sv JUPITER_VERSION HTTP_ENDL;

					result += "Content-Length: 0"sv HTTP_ENDL;

					if (session.keep_alive)
						result += "Connection: keep-alive"sv HTTP_ENDL;
					else
						result += "Connection: close"sv HTTP_ENDL;

					result += HTTP_ENDL HTTP_ENDL;
					session.sock.send(result);
				}
				break;
			default:
				break;
			}

			if (session.keep_alive == false) {// not keep-alive -- will be destroyed on return
				break;
			}

			if (index == lines.size()) { // end of packet
				session.request.erase();
			}
			else { // end of request -- another request is following
				// Maybe there's still some value in a shifty string, to avoid substr calls & heap allocations...
				session.request = session.request.substr(get_line_offset(index));
			}

			if (session.request.find(HTTP_REQUEST_ENDING) != std::string::npos) { // there's another full request already received
				return process_request(session);
			}
			break;
		}

		// Not empty
		auto first_split = jessilib::split_once_view(line, ' ');
		first_token = first_split.first;

		if (first_token.back() == ':') { // header field
			first_token.remove_suffix(1); // trim trailing ':'
			if (jessilib::equalsi(first_token, "HOST"sv)) {
				session.host = find_host(first_split.second);
			}
			else if (jessilib::equalsi(first_token, "CONNECTION"sv)) {
				std::string_view connection_type = first_split.second;
				if (jessilib::equalsi(connection_type, "keep-alive"sv)) {
					session.keep_alive = permit_keept_alive;
				}
			}
		}
		else { // command
			if (first_token == "GET"sv) {
				command = HTTPCommand::GET;

				auto second_split = jessilib::split_once_view(first_split.second, ' ');
				query_string = second_split.first;
				span = query_string.find('?'); // repurposing 'span'
				if (span == std::string_view::npos) {
					if (session.host == nullptr) {
						content = find(query_string);
					}
					else {
						content = session.host->find(query_string);
					}
					query_string = std::string_view{};
				}
				else {
					if (session.host == nullptr) {
						content = find(query_string.substr(size_t{ 0 }, span));
					}
					else {
						content = session.host->find(query_string.substr(size_t{ 0 }, span));
					}
					query_string.remove_prefix(span + 1);
					// decode query_string here
				}

				std::string_view protocol_str = second_split.second;
				if (jessilib::equalsi(protocol_str, "http/1.0"sv)) {
					session.version = HTTPVersion::HTTP_1_0;
				}
				else if (jessilib::equalsi(protocol_str, "http/1.1"sv)) {
					session.version = HTTPVersion::HTTP_1_1;
					session.keep_alive = permit_keept_alive;
				}
			}
			else if (first_token == "HEAD"sv) {
				command = HTTPCommand::HEAD;

				auto second_split = jessilib::split_once_view(first_split.second, ' ');
				query_string = second_split.first;
				span = query_string.find('?'); // repurposing 'span'
				if (span == std::string_view::npos) {
					if (session.host == nullptr) {
						content = find(query_string);
					}
					else {
						content = session.host->find(query_string);
					}
					query_string = std::string_view{};
				}
				else {
					if (session.host == nullptr) {
						content = find(query_string.substr(size_t{ 0 }, span));
					}
					else {
						content = session.host->find(query_string.substr(size_t{ 0 }, span));
					}
					query_string.remove_prefix(span + 1);
					// decode query_string here
				}

				std::string_view protocol_str = second_split.second;
				if (jessilib::equalsi(protocol_str, "http/1.0"sv)) {
					session.version = HTTPVersion::HTTP_1_0;
				}
				else if (jessilib::equalsi(protocol_str, "http/1.1"sv)) {
					session.version = HTTPVersion::HTTP_1_1;
					session.keep_alive = permit_keept_alive;
				}
			}
			else
				command = HTTPCommand::UNKNOWN;
		}
	}
	return 0;
}